

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void api_suite::api_string(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  undefined4 local_14c;
  value local_148 [2];
  undefined1 local_140 [8];
  decoder_type decoder;
  char input [8];
  
  decoder.current.scan.string.segment_tail[0x1f] = (const_pointer)0x226168706c6122;
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder<8ul>
            ((basic_decoder<char> *)local_140,
             (value_type (*) [8])(decoder.current.scan.string.segment_tail + 0x1f));
  local_148[0] = trial::protocol::json::detail::basic_decoder<char>::code
                           ((basic_decoder<char> *)local_140);
  local_14c = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x71,"void api_suite::api_string()",local_148,&local_14c);
  trial::protocol::json::detail::basic_decoder<char>::string_value<std::__cxx11::string>
            (&local_170,(basic_decoder<char> *)local_140);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[6]>
            ("decoder.string_value<std::string>()","\"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x72,"void api_suite::api_string()",&local_170,"alpha");
  std::__cxx11::string::~string((string *)&local_170);
  return;
}

Assistant:

void api_string()
{
    const char input[] = "\"alpha\"";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::string);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.string_value<std::string>(), "alpha");
}